

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

void Sdm_ManTest(void)

{
  Sdm_Man_t *p_00;
  int local_48 [2];
  int pCut [7];
  int uMask;
  int iDsd;
  int iDsd1;
  int iDsd0;
  Sdm_Man_t *p;
  
  local_48[0] = 4;
  local_48[1] = 10;
  pCut[0] = 0x14;
  pCut[1] = 0x1e;
  pCut[2] = 0x28;
  pCut[3] = 0;
  pCut[4] = 0;
  p_00 = Sdm_ManAlloc();
  Sdm_ManComputeFunc(p_00,4,6,local_48,0x3f23f,0);
  Sdm_ManFree(p_00);
  return;
}

Assistant:

void Sdm_ManTest()
{
    Sdm_Man_t * p;
    int iDsd0 = 4;
    int iDsd1 = 6;
    int iDsd;
    int uMask = 0x3FFFF ^ ((7 ^ 0) << 6) ^ ((7 ^ 1) << 9);
    int pCut[7] = { 4, 10, 20, 30, 40 };
//    Sdm_ManPrintPerm( uMask );
    p = Sdm_ManAlloc();
    iDsd = Sdm_ManComputeFunc( p, iDsd0, iDsd1, pCut, uMask, 0 );
    Sdm_ManFree( p );
}